

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

void __thiscall jbcoin::STAmount::setJson(STAmount *this,Value *elem)

{
  Value *pVVar1;
  Currency *currency;
  AccountID *account;
  string local_f8;
  Value local_d8;
  string local_c8;
  Value local_a8;
  string local_98;
  Value local_78 [2];
  string local_58;
  Value local_38;
  Value local_28;
  Value *local_18;
  Value *elem_local;
  STAmount *this_local;
  
  local_18 = elem;
  elem_local = (Value *)this;
  Json::Value::Value(&local_28,objectValue);
  Json::Value::operator=(local_18,&local_28);
  Json::Value::~Value(&local_28);
  if ((this->mIsNative & 1U) == 0) {
    (*(this->super_STBase)._vptr_STBase[6])();
    Json::Value::Value(&local_38,&local_58);
    pVVar1 = Json::Value::operator[](local_18,(StaticString *)&jss::value);
    Json::Value::operator=(pVVar1,&local_38);
    Json::Value::~Value(&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    to_string_abi_cxx11_(&local_98,(jbcoin *)&this->mIssue,currency);
    Json::Value::Value(local_78,&local_98);
    pVVar1 = Json::Value::operator[](local_18,(StaticString *)&jss::currency);
    Json::Value::operator=(pVVar1,local_78);
    Json::Value::~Value(local_78);
    std::__cxx11::string::~string((string *)&local_98);
    to_string_abi_cxx11_(&local_c8,(jbcoin *)&(this->mIssue).account,account);
    Json::Value::Value(&local_a8,&local_c8);
    pVVar1 = Json::Value::operator[](local_18,(StaticString *)&jss::issuer);
    Json::Value::operator=(pVVar1,&local_a8);
    Json::Value::~Value(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  else {
    (*(this->super_STBase)._vptr_STBase[6])();
    Json::Value::Value(&local_d8,&local_f8);
    Json::Value::operator=(local_18,&local_d8);
    Json::Value::~Value(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  return;
}

Assistant:

void STAmount::setJson (Json::Value& elem) const
{
    elem = Json::objectValue;

    if (!mIsNative)
    {
        // It is an error for currency or issuer not to be specified for valid
        // json.
        elem[jss::value]      = getText ();
        elem[jss::currency]   = to_string (mIssue.currency);
        elem[jss::issuer]     = to_string (mIssue.account);
    }
    else
    {
        elem = getText ();
    }
}